

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_VRR_Writer::WriteVRR(OSTEI_VRR_Writer *this,ostream *os)

{
  _Rb_tree_node_base *p_Var1;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  long lVar7;
  char *pcVar8;
  undefined1 *puVar9;
  pointer this_00;
  int iVar10;
  undefined1 local_128 [16];
  _Alloc_hider local_118;
  _Rb_tree_node_base *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  _Rb_tree_node_base *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  QAMList local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"//////////////////////////////////////////////\n",0x2f);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"// Primitive integrals: Vertical recurrance\n",0x2c);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"//////////////////////////////////////////////\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2p((IntSet *)local_128,this->vrr_algo_);
  p_Var1 = (_Rb_tree_node_base *)(local_128 + 8);
  for (p_Var5 = local_110; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_color == _S_black) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      lVar7 = 0x18;
      pcVar8 = "_over_2p = one_over_2p;\n";
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_over_2p = SIMINT_MUL(const_",0x1c)
      ;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      lVar7 = 0x10;
      pcVar8 = ", one_over_2p);\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_128);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2q((IntSet *)local_128,this->vrr_algo_);
  for (p_Var5 = local_110; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_color == _S_black) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      lVar7 = 0x18;
      pcVar8 = "_over_2q = one_over_2q;\n";
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_over_2q = SIMINT_MUL(const_",0x1c)
      ;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      lVar7 = 0x10;
      pcVar8 = ", one_over_2q);\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_128);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2pq((IntSet *)local_128,this->vrr_algo_);
  for (p_Var5 = local_110; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_color == _S_black) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      lVar7 = 0x1a;
      pcVar8 = "_over_2pq = one_over_2pq;\n";
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"_over_2pq = SIMINT_MUL(const_",0x1d);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,p_Var5[1]._M_color);
      lVar7 = 0x11;
      pcVar8 = ", one_over_2pq);\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_128);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
  OSTEI_VRR_Algorithm_Base::GetAMOrder(&local_48,this->vrr_algo_);
  if (local_48.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this_00 = local_48.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data
              ._M_start;
    do {
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
      local_128._0_8_ = 0;
      local_128._8_8_ = 0;
      if (local_f8 == &local_e8) {
        local_108._8_8_ = local_e8._8_8_;
        local_118._M_p = (pointer)&local_108;
      }
      else {
        local_118._M_p = (pointer)local_f8;
      }
      local_108._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_108._M_local_buf[0] = local_e8._M_local_buf[0];
      local_110 = local_f0;
      local_f0 = (_Rb_tree_node_base *)0x0;
      local_e8._M_local_buf[0] = '\0';
      local_f8 = &local_e8;
      bVar3 = QAM::operator==(this_00,(QAM *)local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_p != &local_108) {
        operator_delete(local_118._M_p);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (!bVar3) {
        iVar10 = (this_00->qam)._M_elems[3] + (this_00->qam)._M_elems[1] +
                 (this_00->qam)._M_elems[2] + (this_00->qam)._M_elems[0];
        if (iVar10 < this->start_external_) {
          local_78 = *(undefined8 *)(this_00->qam)._M_elems;
          uStack_70 = *(undefined8 *)((this_00->qam)._M_elems + 2);
          local_68[0] = local_58;
          pcVar2 = (this_00->tag)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_68,pcVar2,pcVar2 + (this_00->tag)._M_string_length);
          (*this->_vptr_OSTEI_VRR_Writer[3])(this,os,&local_78);
          puVar6 = local_58;
          puVar9 = local_68[0];
        }
        else if (iVar10 < this->start_general_) {
          local_a8 = *(undefined8 *)(this_00->qam)._M_elems;
          uStack_a0 = *(undefined8 *)((this_00->qam)._M_elems + 2);
          local_98[0] = local_88;
          pcVar2 = (this_00->tag)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,pcVar2,pcVar2 + (this_00->tag)._M_string_length);
          (*this->_vptr_OSTEI_VRR_Writer[4])(this,os,&local_a8);
          puVar6 = local_88;
          puVar9 = local_98[0];
        }
        else {
          local_d8._M_allocated_capacity = *(undefined8 *)(this_00->qam)._M_elems;
          local_d8._8_8_ = *(undefined8 *)((this_00->qam)._M_elems + 2);
          local_c8[0] = local_b8;
          pcVar2 = (this_00->tag)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,pcVar2,pcVar2 + (this_00->tag)._M_string_length);
          (*this->_vptr_OSTEI_VRR_Writer[5])(this,os,&local_d8);
          puVar6 = local_b8;
          puVar9 = local_c8[0];
        }
        if (puVar9 != puVar6) {
          operator_delete(puVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_48.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_48);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR(std::ostream & os) const
{
    os << "\n";
    os << indent5 << "//////////////////////////////////////////////\n";
    os << indent5 << "// Primitive integrals: Vertical recurrance\n";
    os << indent5 << "//////////////////////////////////////////////\n";
    os << "\n";

    // constants
    for(const auto & it : vrr_algo_.GetAllInt_2p())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = one_over_2p;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = SIMINT_MUL(const_" << it << ", one_over_2p);\n";
    }

    for(const auto & it : vrr_algo_.GetAllInt_2q())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = one_over_2q;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = SIMINT_MUL(const_" << it << ", one_over_2q);\n";
    }

    for(const auto & it : vrr_algo_.GetAllInt_2pq())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = one_over_2pq;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = SIMINT_MUL(const_" << it << ", one_over_2pq);\n";
    }

    os << "\n\n";

    // actually write out
    for(const auto & am : vrr_algo_.GetAMOrder())
    {
        if(am == QAM{0,0,0,0})
            continue;

        int L = am[0] + am[1] + am[2] + am[3];
        if(L < start_external_)
            WriteVRR_Inline_(os, am);
        else if(L < start_general_)
            WriteVRR_External_(os, am);
        else
            WriteVRR_General_(os, am);

        os << "\n\n";
    }
    
}